

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O3

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs;
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  MessageType MVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  pointer pcVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pcVar11;
  ulong uVar12;
  MessageType messageType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string err;
  cmListFileContext execContext;
  cmListFileContext conditionContext;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_224;
  cmMakefile *local_220;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_218;
  cmMakefile *local_200;
  string local_1f8;
  cmListFileBacktrace local_1d8;
  cmExecutionStatus *local_198;
  pointer local_190;
  cmCommandContext local_188;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  long local_120;
  cmListFileContext local_118;
  undefined1 local_d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  cmListFileBacktrace local_80;
  
  iVar7 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"while");
  if (iVar7 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar7 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar7 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_d0,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if ((cmMakefile *)local_d0._0_8_ == (cmMakefile *)0x0) {
          return false;
        }
        local_200 = (cmMakefile *)local_d0._0_8_;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_local_buf[0] = '\0';
        local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inArgs = &this->Args;
        cmMakefile::ExpandArguments(mf,inArgs,&local_218,(char *)0x0);
        local_160[0] = local_150;
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_160,pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length);
        local_140[0] = local_130;
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                            _M_string_length);
        local_188.Line = (this->super_cmFunctionBlocker).StartingContext.Line;
        local_188.Name._M_dataplus._M_p = (pointer)&local_188.Name.field_2;
        local_188.Name._M_string_length = 0;
        local_188.Name.field_2._M_local_buf[0] = '\0';
        local_120 = local_188.Line;
        std::__cxx11::string::_M_assign((string *)&local_188);
        cmConditionEvaluator::GetConditionContext
                  (&local_118,mf,&local_188,
                   &(this->super_cmFunctionBlocker).StartingContext.FilePath);
        cmMakefile::GetBacktrace(&local_1d8,mf,&local_188);
        cmConditionEvaluator::cmConditionEvaluator
                  ((cmConditionEvaluator *)local_d0,mf,&local_118,&local_1d8);
        local_220 = mf;
        local_198 = inStatus;
        cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
        bVar6 = cmConditionEvaluator::IsTrue
                          ((cmConditionEvaluator *)local_d0,&local_218,&local_1f8,&local_224);
        do {
          if (bVar6 == false) {
LAB_002cc0af:
            cmListFileBacktrace::~cmListFileBacktrace(&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_p != &local_98) {
              operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._8_8_ != &local_b8) {
              operator_delete((void *)local_d0._8_8_,(ulong)(local_b8._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.FilePath._M_dataplus._M_p != &local_118.FilePath.field_2) {
              operator_delete(local_118.FilePath._M_dataplus._M_p,
                              local_118.FilePath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.Name._M_dataplus._M_p != &local_118.Name.field_2) {
              operator_delete(local_118.Name._M_dataplus._M_p,
                              local_118.Name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188.Name._M_dataplus._M_p != &local_188.Name.field_2) {
              operator_delete(local_188.Name._M_dataplus._M_p,
                              CONCAT71(local_188.Name.field_2._M_allocated_capacity._1_7_,
                                       local_188.Name.field_2._M_local_buf[0]) + 1);
            }
            if (local_140[0] != local_130) {
              operator_delete(local_140[0],local_130[0] + 1);
            }
            if (local_160[0] != local_150) {
              operator_delete(local_160[0],local_150[0] + 1);
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,
                              CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                       local_1f8.field_2._M_local_buf[0]) + 1);
            }
            (**(code **)(*(long *)&(local_200->CMP0054ReportedIds)._M_t._M_impl + 0x18))();
            return true;
          }
          if (local_1f8._M_string_length != 0) {
            local_1d8.Context.Name._M_dataplus._M_p = (pointer)&local_1d8.Context.Name.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"had incorrect arguments: ","");
            if ((this->Args).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (this->Args).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar9 = 0;
              uVar12 = 1;
              do {
                std::__cxx11::string::append((char *)&local_1d8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d8,
                           (ulong)(inArgs->
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar9].Value.
                                  _M_dataplus._M_p);
                std::__cxx11::string::append((char *)&local_1d8);
                std::__cxx11::string::append((char *)&local_1d8);
                uVar9 = ((long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                ;
                bVar6 = uVar12 <= uVar9;
                lVar3 = uVar9 - uVar12;
                uVar9 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar6 && lVar3 != 0);
            }
            std::__cxx11::string::append((char *)&local_1d8);
            std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1f8._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_1d8);
            MVar4 = local_224;
            cmMakefile::IssueMessage(local_220,local_224,(string *)&local_1d8,false);
            if (MVar4 == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8.Context.Name._M_dataplus._M_p != &local_1d8.Context.Name.field_2) {
                operator_delete(local_1d8.Context.Name._M_dataplus._M_p,
                                local_1d8.Context.Name.field_2._M_allocated_capacity + 1);
              }
              goto LAB_002cc0af;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8.Context.Name._M_dataplus._M_p != &local_1d8.Context.Name.field_2) {
              operator_delete(local_1d8.Context.Name._M_dataplus._M_p,
                              local_1d8.Context.Name.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar8 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar8) {
            uVar9 = 0;
            uVar12 = 1;
            do {
              local_1d8.Context.Name._M_dataplus._M_p =
                   local_1d8.Context.Name._M_dataplus._M_p & 0xffffffff00000000;
              cmMakefile::ExecuteCommand(local_220,pcVar8 + uVar9,(cmExecutionStatus *)&local_1d8);
              if ((char)local_1d8.Context.Name._M_dataplus._M_p == '\x01') {
                local_198->ReturnInvoked = true;
                goto LAB_002cc0af;
              }
              if (local_1d8.Context.Name._M_dataplus._M_p._1_1_ != '\0') goto LAB_002cc0af;
              if (local_1d8.Context.Name._M_dataplus._M_p._2_1_ != '\0') break;
              if ((cmSystemTools::s_FatalErrorOccured != false) ||
                 (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) goto LAB_002cc0af;
              pcVar8 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              bVar6 = uVar12 < (ulong)((long)(this->Functions).
                                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pcVar8 >> 6);
              uVar9 = uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (bVar6);
          }
          pcVar5 = local_218.
                   super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_218.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_218.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_190 = local_218.
                        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            paVar10 = &((local_218.
                         super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Value).field_2;
            do {
              plVar2 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
              if (paVar10 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar10->_M_allocated_capacity + 1);
              }
              pcVar11 = (pointer)((long)paVar10 + 0x18);
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar10 + 0x28);
            } while (pcVar11 != pcVar5);
            local_218.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = local_190;
          }
          cmMakefile::ExpandArguments(local_220,inArgs,&local_218,(char *)0x0);
          bVar6 = cmConditionEvaluator::IsTrue
                            ((cmConditionEvaluator *)local_d0,&local_218,&local_1f8,&local_224);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmListFileContext conditionContext =
          cmConditionEvaluator::GetConditionContext(
            &mf, commandContext,
            this->GetStartingContext().FilePath);

      cmConditionEvaluator conditionEvaluator(
            mf, conditionContext,
            mf.GetBacktrace(commandContext));

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}